

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O3

uint getaddrinfo_thread(void *arg)

{
  void *pvVar1;
  int iVar2;
  int *piVar3;
  char service [12];
  char local_2c [12];
  
  pvVar1 = *(void **)((long)arg + 0x58);
  curl_msnprintf(local_2c,0xc,"%d",(ulong)*(uint *)((long)arg + 0x18));
  iVar2 = Curl_getaddrinfo_ex(*(char **)((long)arg + 0x10),local_2c,(addrinfo *)((long)arg + 0x28),
                              (Curl_addrinfo **)((long)arg + 0x20));
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      iVar2 = *piVar3;
    }
    *(int *)((long)arg + 0x1c) = iVar2;
  }
  pthread_mutex_lock(*arg);
  if (*(int *)((long)arg + 8) == 0) {
    *(undefined4 *)((long)arg + 8) = 1;
    pthread_mutex_unlock(*arg);
  }
  else {
    pthread_mutex_unlock(*arg);
    destroy_thread_sync_data((thread_sync_data *)arg);
    (*Curl_cfree)(pvVar1);
  }
  return 0;
}

Assistant:

static unsigned int CURL_STDCALL getaddrinfo_thread(void *arg)
{
  struct thread_sync_data *tsd = (struct thread_sync_data*)arg;
  struct thread_data *td = tsd->td;
  char service[12];
  int rc;

  snprintf(service, sizeof(service), "%d", tsd->port);

  rc = Curl_getaddrinfo_ex(tsd->hostname, service, &tsd->hints, &tsd->res);

  if(rc != 0) {
    tsd->sock_error = SOCKERRNO?SOCKERRNO:rc;
    if(tsd->sock_error == 0)
      tsd->sock_error = RESOLVER_ENOMEM;
  }
  else {
    Curl_addrinfo_set_port(tsd->res, tsd->port);
  }

  Curl_mutex_acquire(tsd->mtx);
  if(tsd->done) {
    /* too late, gotta clean up the mess */
    Curl_mutex_release(tsd->mtx);
    destroy_thread_sync_data(tsd);
    free(td);
  }
  else {
    tsd->done = 1;
    Curl_mutex_release(tsd->mtx);
  }

  return 0;
}